

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

string * __thiscall slang::ast::EvalContext::dumpStack_abi_cxx11_(EvalContext *this)

{
  format_string<int,_const_std::basic_string_view<char>_> fmt;
  format_string<const_std::basic_string_view<char>_&,_std::__cxx11::basic_string<char>_> fmt_00;
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  type *value;
  type *symbol;
  const_iterator __end3;
  const_iterator __begin3;
  map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  *__range3;
  Frame *frame;
  const_iterator __end2;
  const_iterator __begin2;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *__range2;
  int index;
  FormatBuffer buffer;
  FormatBuffer *in_stack_fffffffffffffce8;
  FormatBuffer *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd40;
  FormatBuffer *in_stack_fffffffffffffd48;
  reference in_stack_fffffffffffffd50;
  const_iterator in_stack_fffffffffffffd58;
  _Self local_2a0;
  const_iterator local_298;
  size_t local_280;
  char *local_278;
  int local_26c;
  char *local_268;
  undefined8 local_260;
  const_iterator local_258;
  const_iterator local_250;
  const_iterator local_248;
  SmallVectorBase<slang::ast::EvalContext::Frame> *local_240;
  int local_234;
  
  this_01 = in_RDI;
  FormatBuffer::FormatBuffer(in_stack_fffffffffffffcf0);
  local_234 = 0;
  local_240 = (SmallVectorBase<slang::ast::EvalContext::Frame> *)(in_RSI + 0x50);
  local_248 = SmallVectorBase<slang::ast::EvalContext::Frame>::begin(local_240);
  local_250 = SmallVectorBase<slang::ast::EvalContext::Frame>::end(local_240);
  for (; local_248 != local_250; local_248 = local_248 + 1) {
    local_258 = local_248;
    local_268 = "{}: {}\n";
    local_260 = 7;
    local_26c = local_234;
    if (local_248->subroutine == (SubroutineSymbol *)0x0) {
      local_234 = local_234 + 1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_01,(char *)in_RDI);
    }
    else {
      local_280 = (local_248->subroutine->super_Symbol).name._M_len;
      local_278 = (local_248->subroutine->super_Symbol).name._M_str;
      local_234 = local_234 + 1;
    }
    fmt.str.size_ = (size_t)in_stack_fffffffffffffd58._M_node;
    fmt.str.data_ = (char *)in_stack_fffffffffffffd50;
    FormatBuffer::format<int,std::basic_string_view<char,std::char_traits<char>>const>
              (in_stack_fffffffffffffd48,fmt,(int *)in_stack_fffffffffffffd40,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd38);
    local_298 = local_258;
    local_2a0._M_node =
         (_Base_ptr)
         std::
         map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
         ::begin((map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
                  *)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd58 =
         std::
         map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
         ::end((map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
                *)in_stack_fffffffffffffce8);
    while( true ) {
      bVar1 = std::operator==(&local_2a0,(_Self *)&stack0xfffffffffffffd58);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffd50 =
           std::
           _Rb_tree_const_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
           ::operator*((_Rb_tree_const_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
                        *)0x607b5f);
      in_stack_fffffffffffffd48 =
           (FormatBuffer *)
           std::get<0ul,slang::ast::ValueSymbol_const*const,slang::ConstantValue>
                     ((pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue> *)0x607b6e);
      in_stack_fffffffffffffd40 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           std::get<1ul,slang::ast::ValueSymbol_const*const,slang::ConstantValue>
                     ((pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue> *)0x607b7d);
      in_stack_fffffffffffffd38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(((type)(in_stack_fffffffffffffd48->buf).super_buffer<char>.ptr_)->super_Symbol).
                 name;
      slang::ConstantValue::toString_abi_cxx11_
                ((ConstantValue *)in_RDI,(bitwidth_t)((ulong)this_00 >> 0x20),
                 SUB81((ulong)this_00 >> 0x18,0),SUB81((ulong)this_00 >> 0x10,0));
      fmt_00.str.size_ = (size_t)in_stack_fffffffffffffd58._M_node;
      fmt_00.str.data_ = (char *)in_stack_fffffffffffffd50;
      FormatBuffer::
      format<std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string>
                (in_stack_fffffffffffffd48,fmt_00,in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(this_00);
      std::
      _Rb_tree_const_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
                    *)this_00);
    }
  }
  FormatBuffer::str_abi_cxx11_(in_stack_fffffffffffffce8);
  FormatBuffer::~FormatBuffer((FormatBuffer *)0x607c72);
  return this_01;
}

Assistant:

std::string EvalContext::dumpStack() const {
    FormatBuffer buffer;
    int index = 0;
    for (const Frame& frame : stack) {
        buffer.format("{}: {}\n", index++, frame.subroutine ? frame.subroutine->name : "<global>");
        for (auto& [symbol, value] : frame.temporaries)
            buffer.format("    {} = {}\n", symbol->name, value.toString());
    }
    return buffer.str();
}